

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

uint64 __thiscall google::protobuf::internal::ArenaImpl::SerialArena::SpaceUsed(SerialArena *this)

{
  char *pcVar1;
  Block *pBVar2;
  char *pcVar3;
  long lVar4;
  
  pcVar1 = this->ptr_;
  pcVar3 = Block::Pointer(this->head_,0x18);
  lVar4 = (long)pcVar1 - (long)pcVar3;
  for (pBVar2 = this->head_->next_; pBVar2 != (Block *)0x0; pBVar2 = pBVar2->next_) {
    lVar4 = lVar4 + pBVar2->pos_ + -0x18;
  }
  return lVar4 - 0x48;
}

Assistant:

uint64 ArenaImpl::SerialArena::SpaceUsed() const {
  // Get current block's size from ptr_ (since we can't trust head_->pos().
  uint64 space_used = ptr_ - head_->Pointer(kBlockHeaderSize);
  // Get subsequent block size from b->pos().
  for (Block* b = head_->next(); b; b = b->next()) {
    space_used += (b->pos() - kBlockHeaderSize);
  }
  // Remove the overhead of the SerialArena itself.
  space_used -= kSerialArenaSize;
  return space_used;
}